

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcPrsSymtab::CTcPrsSymtab(CTcPrsSymtab *this,CTcPrsSymtab *parent_scope)

{
  int own_hash_func;
  CVmHashFunc *pCVar1;
  size_t in_RSI;
  CVmHashTable *in_RDI;
  size_t hash_table_size;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  size_t in_stack_ffffffffffffffd0;
  CVmHashFunc *hash_function;
  
  in_RDI->table_ = (CVmHashEntry **)&PTR__CTcPrsSymtab_0042fd28;
  own_hash_func = 0x20;
  if (in_RSI == 0) {
    own_hash_func = 0x200;
  }
  pCVar1 = (CVmHashFunc *)
           ::operator_new(in_stack_ffffffffffffffd0,
                          (CTcPrsMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                         );
  hash_function = hash_func_;
  operator_new__((size_t)hash_func_,(CTcPrsMem *)CONCAT44(own_hash_func,in_stack_ffffffffffffffc8));
  CVmHashTable::CVmHashTable
            (in_RDI,(int)((ulong)pCVar1 >> 0x20),hash_function,own_hash_func,
             (CVmHashEntry **)0x2aded9);
  in_RDI->hash_function_ = pCVar1;
  in_RDI->table_size_ = in_RSI;
  *(undefined4 *)&in_RDI[1].table_size_ = 0;
  in_RDI[1].table_ = (CVmHashEntry **)0x0;
  *(undefined4 *)&in_RDI->field_0x1c = 0;
  *(undefined4 *)&in_RDI->field_0x18 = 0;
  return;
}

Assistant:

CTcPrsSymtab::CTcPrsSymtab(CTcPrsSymtab *parent_scope)
{
    size_t hash_table_size;
    
    /* 
     *   Create the hash table.  If we're at global scope (parent_scope ==
     *   0), create a large hash table, since we'll probably add lots of
     *   symbols; otherwise, it's just a local table, which probably won't
     *   have many entries, so create a small table.
     *   
     *   Note that we always use the static hash function object, hence
     *   the table doesn't own the object.  
     */
    hash_table_size = (parent_scope == 0 ? 512 : 32);
    hashtab_ = new (G_prsmem)
               CVmHashTable(hash_table_size, hash_func_, FALSE,
                            new (G_prsmem) CVmHashEntry *[hash_table_size]);

    /* remember the parent scope */
    parent_ = parent_scope;

    /* we're not in a debugger frame list yet */
    list_index_ = 0;
    list_next_ = 0;

    /* we don't have a generated byte code range yet */
    start_ofs_ = end_ofs_ = 0;
}